

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O2

void * nghttp2_map_find(nghttp2_map *map,nghttp2_map_key_type key)

{
  void *pvVar1;
  char cVar2;
  nghttp2_map_bucket *pnVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  cVar2 = (char)map->tablelenbits;
  uVar4 = (uint)(key * -0x61c88647) >> (-cVar2 & 0x1fU);
  uVar5 = 0;
  while( true ) {
    pvVar1 = map->table[uVar4].data;
    if (pvVar1 == (void *)0x0) {
      return (void *)0x0;
    }
    pnVar3 = map->table + uVar4;
    uVar6 = map->tablelen - 1;
    if ((uVar4 - (pnVar3->hash >> (0x20U - cVar2 & 0x1f)) & uVar6) < uVar5) break;
    if (pnVar3->key == key) {
      return pvVar1;
    }
    uVar5 = uVar5 + 1;
    uVar4 = uVar4 + 1 & uVar6;
  }
  return (void *)0x0;
}

Assistant:

void *nghttp2_map_find(nghttp2_map *map, nghttp2_map_key_type key) {
  uint32_t h = hash(key);
  size_t idx = h2idx(h, map->tablelenbits);
  nghttp2_map_bucket *bkt;
  size_t d = 0;

  for (;;) {
    bkt = &map->table[idx];

    if (bkt->data == NULL ||
        d > distance(map->tablelen, map->tablelenbits, bkt, idx)) {
      return NULL;
    }

    if (bkt->key == key) {
      return bkt->data;
    }

    ++d;
    idx = (idx + 1) & (map->tablelen - 1);
  }
}